

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

string * draco::ReplaceFileExtension
                   (string *__return_storage_ptr__,string *in_file_name,string *new_extension)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = std::__cxx11::string::rfind((char)in_file_name,0x2e);
  if (lVar1 == -1) {
    std::operator+(&local_40,in_file_name,".");
    std::operator+(__return_storage_ptr__,&local_40,new_extension);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)in_file_name);
    std::operator+(__return_storage_ptr__,&local_40,new_extension);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceFileExtension(const std::string &in_file_name,
                                 const std::string &new_extension) {
  const auto pos = in_file_name.find_last_of('.');
  if (pos == std::string::npos) {
    // No extension found.
    return in_file_name + "." + new_extension;
  }
  return in_file_name.substr(0, pos + 1) + new_extension;
}